

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

string * ShellEscape(string *arg)

{
  long lVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  long in_FS_OFFSET;
  string escaped;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string *substitute;
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__a;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = in_RDI;
  __a = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffff70,in_RDI);
  substitute = (string *)&stack0xffffffffffffff77;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,(allocator<char> *)__a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,(allocator<char> *)__a);
  util::ReplaceAll(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,substitute);
  std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff76);
  std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff77);
  std::operator+((char *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return __lhs;
  }
  __stack_chk_fail();
}

Assistant:

std::string ShellEscape(const std::string& arg)
{
    std::string escaped = arg;
    ReplaceAll(escaped, "'", "'\"'\"'");
    return "'" + escaped + "'";
}